

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O1

decNumber_conflict * decNumberFromInt32(decNumber_conflict *dn,int32_t in)

{
  uint32_t uin;
  
  uin = -in;
  if (0 < in) {
    uin = in;
  }
  decNumberFromUInt32(dn,uin);
  if (in < 0) {
    dn->bits = 0x80;
  }
  return dn;
}

Assistant:

decNumber * decNumberFromInt32(decNumber *dn, Int in) {
  uInt unsig;
  if (in>=0) unsig=in;
   else {				/* negative (possibly BADINT) */
    if (in==BADINT) unsig=(uInt)1073741824*2; /* special case */
     else unsig=-in;			/* invert */
    }
  /* in is now positive */
  decNumberFromUInt32(dn, unsig);
  if (in<0) dn->bits=DECNEG;		/* sign needed */
  return dn;
  }